

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_data.c
# Opt level: O0

int cmd_data_store(ly_ctx **ctx,yl_opt *yo,char *posv)

{
  int iVar1;
  cmdline_file *pcVar2;
  LYD_FORMAT local_34;
  ly_in *plStack_30;
  LYD_FORMAT format_data;
  ly_in *in;
  char *posv_local;
  yl_opt *yo_local;
  ly_ctx **ctx_local;
  
  in = (ly_in *)posv;
  posv_local = (char *)yo;
  yo_local = (yl_opt *)ctx;
  if (posv != (char *)0x0) {
    local_34 = yo->data_in_format;
    iVar1 = get_input(posv,(LYS_INFORMAT *)0x0,&local_34,&stack0xffffffffffffffd0);
    if (iVar1 == 0) {
      pcVar2 = fill_cmdline_file((ly_set *)(posv_local + 0xa8),plStack_30,(char *)in,local_34);
      if (pcVar2 == (cmdline_file *)0x0) {
        ly_in_free(plStack_30,1);
        ctx_local._4_4_ = 1;
      }
      else {
        ctx_local._4_4_ = 0;
      }
    }
    else {
      ctx_local._4_4_ = 1;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("posv",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/tools/lint/cmd_data.c"
                ,0x167,"int cmd_data_store(struct ly_ctx **, struct yl_opt *, const char *)");
}

Assistant:

int
cmd_data_store(struct ly_ctx **ctx, struct yl_opt *yo, const char *posv)
{
    (void) ctx;
    struct ly_in *in;
    LYD_FORMAT format_data;

    assert(posv);

    format_data = yo->data_in_format;

    /* process input data files provided as standalone command line arguments */
    if (get_input(posv, NULL, &format_data, &in)) {
        return 1;
    }

    if (!fill_cmdline_file(&yo->data_inputs, in, posv, format_data)) {
        ly_in_free(in, 1);
        return 1;
    }

    return 0;
}